

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::deflate_stream_test::testFlushAtLiteralBufferFull::fixture::~fixture(fixture *this)

{
  fixture *this_local;
  
  std::__cxx11::string::~string((string *)&this->out);
  return;
}

Assistant:

explicit fixture(ICompressor&c, std::size_t n, Strategy s) : c(c)
            {
                c.init(8, 15, 1, static_cast<int>(s));
                std::iota(in.begin(), in.end(), std::uint8_t{0});
                out.resize(n);
                c.next_in(in.data());
                c.avail_in(in.size());
                c.next_out(&out.front());
                c.avail_out(out.size());
            }